

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O0

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectTransformationMatrix
          (CXMeshFileLoader *this,matrix4 *mat)

{
  bool bVar1;
  long in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  matrix4 *in_stack_ffffffffffffff88;
  CXMeshFileLoader *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff9c;
  CXMeshFileLoader *in_stack_ffffffffffffffa0;
  CXMeshFileLoader *in_stack_ffffffffffffffa8;
  stringc *in_stack_ffffffffffffffd0;
  CXMeshFileLoader *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = readHeadOfDataObject(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (bVar1) {
    readMatrix(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    bVar1 = checkForOneFollowingSemicolons(in_stack_ffffffffffffffa8);
    if (!bVar1) {
      os::Printer::log((Printer *)"No finishing semicolon in Transformation Matrix found in x file",
                       __x_01);
      core::string<char>::string
                ((string<char> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      core::string<char>::c_str((string<char> *)0x2e6383);
      os::Printer::log(__x_02);
      core::string<char>::~string((string<char> *)0x2e63a1);
    }
    bVar1 = checkForClosingBrace(in_stack_ffffffffffffffa0);
    if (bVar1) {
      local_1 = true;
    }
    else {
      os::Printer::log((Printer *)"No closing brace in Transformation Matrix found in x file",__x_03
                      );
      core::string<char>::string
                ((string<char> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      core::string<char>::c_str((string<char> *)0x2e63dc);
      os::Printer::log(__x_04);
      core::string<char>::~string((string<char> *)0x2e63fa);
      *(undefined1 *)(in_RDI + 0x50) = 1;
      local_1 = false;
    }
  }
  else {
    os::Printer::log((Printer *)"No opening brace in Transformation Matrix found in x file",__x);
    core::string<char>::string((string<char> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    core::string<char>::c_str((string<char> *)0x2e6305);
    os::Printer::log(__x_00);
    core::string<char>::~string((string<char> *)0x2e6323);
    *(undefined1 *)(in_RDI + 0x50) = 1;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectTransformationMatrix(core::matrix4 &mat)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: Reading Transformation Matrix", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Transformation Matrix found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	readMatrix(mat);

	if (!checkForOneFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Transformation Matrix found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in Transformation Matrix found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	return true;
}